

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bsc.c
# Opt level: O0

void load_param_L_once(void)

{
  double dVar1;
  int local_3c;
  int i;
  char *env_names [5];
  
  memcpy(&stack0xffffffffffffffc8,&PTR_anon_var_dwarf_3629c_00147d10,0x28);
  for (local_3c = 0; local_3c < 5; local_3c = local_3c + 1) {
    if (*(long *)(&stack0xffffffffffffffc8 + (long)local_3c * 8) != 0) {
      dVar1 = load_param(*(char **)(&stack0xffffffffffffffc8 + (long)local_3c * 8),10000.0,"bsc_L");
      s_L[local_3c] = dVar1;
    }
  }
  return;
}

Assistant:

static void load_param_L_once(void) {
    const char * env_names[] = { 
        "BSC_PUT_L", "BSP_HPPUT_L", "BSP_GET_L",
        "BSP_HPGET_L", "BSP_SEND_L" } ;
    int i;
    for ( i = 0; i < BSC_N_REQUEST_TYPES; ++i )
        if (env_names[i])
                s_L[i] = load_param(env_names[i], 1.0e+4, "bsc_L");
}